

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

void log_tap_result(int test_count,char *test,int status,process_info_t *process)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  char local_438 [4];
  int reason_length;
  char reason [1024];
  char *directive;
  char *result;
  process_info_t *process_local;
  int status_local;
  char *test_local;
  int test_count_local;
  
  if (status == 0) {
    directive = "ok";
    reason._1016_8_ = (long)"Exiting child \n" + 0xf;
  }
  else if (status == 1) {
    directive = "ok";
    reason._1016_8_ = anon_var_dwarf_4a76;
  }
  else {
    directive = "not ok";
    reason._1016_8_ = (long)"Exiting child \n" + 0xf;
  }
  if ((status == 1) && (lVar2 = process_output_size(process), 0 < lVar2)) {
    process_read_last_line(process,local_438,0x400);
    sVar3 = strlen(local_438);
    iVar1 = (int)sVar3;
    if ((0 < iVar1) && (local_438[iVar1 + -1] == '\n')) {
      local_438[iVar1 + -1] = '\0';
    }
  }
  else {
    local_438[0] = '\0';
  }
  fprintf(_stderr,"%s %d - %s%s%s\n",directive,(ulong)(uint)test_count,test,reason._1016_8_,
          local_438);
  fflush(_stderr);
  return;
}

Assistant:

void log_tap_result(int test_count,
                    const char* test,
                    int status,
                    process_info_t* process) {
  const char* result;
  const char* directive;
  char reason[1024];
  int reason_length;

  switch (status) {
  case TEST_OK:
    result = "ok";
    directive = "";
    break;
  case TEST_SKIP:
    result = "ok";
    directive = " # SKIP ";
    break;
  default:
    result = "not ok";
    directive = "";
  }

  if (status == TEST_SKIP && process_output_size(process) > 0) {
    process_read_last_line(process, reason, sizeof reason);
    reason_length = strlen(reason);
    if (reason_length > 0 && reason[reason_length - 1] == '\n')
      reason[reason_length - 1] = '\0';
  } else {
    reason[0] = '\0';
  }

  fprintf(stderr, "%s %d - %s%s%s\n", result, test_count, test, directive, reason);
  fflush(stderr);
}